

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

ExtractResult
absl::lts_20250127::cord_internal::CordRepBtree::ExtractAppendBuffer
          (CordRepBtree *tree,size_t extra_capacity)

{
  ExtractResult EVar1;
  bool bVar2;
  int iVar3;
  CordRep *pCVar4;
  size_t sVar5;
  size_t sVar6;
  int height;
  size_t avail;
  size_t length;
  CordRepFlat *flat;
  CordRep *rep;
  NodeStack stack;
  int local_2c;
  int depth;
  size_t extra_capacity_local;
  CordRepBtree *tree_local;
  ExtractResult result;
  
  local_2c = 0;
  result.tree = (CordRep *)0x0;
  extra_capacity_local = (size_t)tree;
  while (iVar3 = CordRepBtree::height((CordRepBtree *)extra_capacity_local), tree_local = tree,
        0 < iVar3) {
    bVar2 = RefcountAndFlags::IsOne((RefcountAndFlags *)(extra_capacity_local + 8));
    if (!bVar2) goto LAB_01c24c93;
    stack[(long)local_2c + -1] = (CordRepBtree *)extra_capacity_local;
    pCVar4 = Edge((CordRepBtree *)extra_capacity_local,kBack);
    extra_capacity_local = (size_t)CordRep::btree(pCVar4);
    local_2c = local_2c + 1;
  }
  bVar2 = RefcountAndFlags::IsOne((RefcountAndFlags *)(extra_capacity_local + 8));
  if (bVar2) {
    pCVar4 = Edge((CordRepBtree *)extra_capacity_local,kBack);
    bVar2 = CordRep::IsFlat(pCVar4);
    if ((bVar2) && (bVar2 = RefcountAndFlags::IsOne(&pCVar4->refcount), bVar2)) {
      pCVar4 = &CordRep::flat(pCVar4)->super_CordRep;
      sVar6 = ((CordRep *)&pCVar4->length)->length;
      sVar5 = CordRepFlat::Capacity((CordRepFlat *)pCVar4);
      if (extra_capacity <= sVar5 - ((CordRep *)&pCVar4->length)->length) {
        while (sVar5 = size((CordRepBtree *)extra_capacity_local), result.tree = pCVar4, sVar5 == 1)
        {
          Delete((CordRepBtree *)extra_capacity_local);
          local_2c = local_2c + -1;
          if (local_2c < 0) {
            tree_local = (CordRepBtree *)0x0;
            goto LAB_01c24c93;
          }
          extra_capacity_local = (size_t)stack[(long)local_2c + -1];
        }
        sVar5 = end((CordRepBtree *)extra_capacity_local);
        set_end((CordRepBtree *)extra_capacity_local,sVar5 - 1);
        *(size_t *)extra_capacity_local = *(long *)extra_capacity_local - sVar6;
        while (0 < local_2c) {
          local_2c = local_2c + -1;
          extra_capacity_local = (size_t)stack[(long)local_2c + -1];
          (((CordRepBtree *)extra_capacity_local)->super_CordRep).length =
               (((CordRepBtree *)extra_capacity_local)->super_CordRep).length - sVar6;
        }
        while (sVar6 = size((CordRepBtree *)extra_capacity_local), sVar6 == 1) {
          iVar3 = CordRepBtree::height((CordRepBtree *)extra_capacity_local);
          tree_local = (CordRepBtree *)Edge((CordRepBtree *)extra_capacity_local,kBack);
          Delete((CordRepBtree *)extra_capacity_local);
          if (iVar3 == 0) goto LAB_01c24c93;
          extra_capacity_local = (size_t)CordRep::btree((CordRep *)tree_local);
        }
        tree_local = (CordRepBtree *)extra_capacity_local;
      }
    }
  }
LAB_01c24c93:
  EVar1.extracted = result.tree;
  EVar1.tree = &tree_local->super_CordRep;
  return EVar1;
}

Assistant:

CordRepBtree::ExtractResult CordRepBtree::ExtractAppendBuffer(
    CordRepBtree* tree, size_t extra_capacity) {
  int depth = 0;
  NodeStack stack;

  // Set up default 'no success' result which is {tree, nullptr}.
  ExtractResult result;
  result.tree = tree;
  result.extracted = nullptr;

  // Dive down the right side of the tree, making sure no edges are shared.
  while (tree->height() > 0) {
    if (!tree->refcount.IsOne()) return result;
    stack[depth++] = tree;
    tree = tree->Edge(kBack)->btree();
  }
  if (!tree->refcount.IsOne()) return result;

  // Validate we ended on a non shared flat.
  CordRep* rep = tree->Edge(kBack);
  if (!(rep->IsFlat() && rep->refcount.IsOne())) return result;

  // Verify it has at least the requested extra capacity.
  CordRepFlat* flat = rep->flat();
  const size_t length = flat->length;
  const size_t avail = flat->Capacity() - flat->length;
  if (extra_capacity > avail) return result;

  // Set the extracted flat in the result.
  result.extracted = flat;

  // Cascading delete all nodes that become empty.
  while (tree->size() == 1) {
    CordRepBtree::Delete(tree);
    if (--depth < 0) {
      // We consumed the entire tree: return nullptr for new tree.
      result.tree = nullptr;
      return result;
    }
    rep = tree;
    tree = stack[depth];
  }

  // Remove the edge or cascaded up parent node.
  tree->set_end(tree->end() - 1);
  tree->length -= length;

  // Adjust lengths up the tree.
  while (depth > 0) {
    tree = stack[--depth];
    tree->length -= length;
  }

  // Remove unnecessary top nodes with size = 1. This may iterate all the way
  // down to the leaf node in which case we simply return the remaining last
  // edge in that node and the extracted flat.
  while (tree->size() == 1) {
    int height = tree->height();
    rep = tree->Edge(kBack);
    Delete(tree);
    if (height == 0) {
      // We consumed the leaf: return the sole data edge as the new tree.
      result.tree = rep;
      return result;
    }
    tree = rep->btree();
  }

  // Done: return the (new) top level node and extracted flat.
  result.tree = tree;
  return result;
}